

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  ushort uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar4 = 0;
  if (pY->nSkip <= pX->nSkip) {
    uVar1 = pX->nLTerm;
    if ((int)((uint)uVar1 - (uint)pX->nSkip) < (int)((uint)pY->nLTerm - (uint)pY->nSkip)) {
      if ((pX->rRun < pY->rRun) || ((pX->rRun <= pY->rRun && (pX->nOut <= pY->nOut)))) {
        if ((ulong)uVar1 != 0) {
          uVar5 = (ulong)uVar1;
          do {
            uVar6 = (ulong)pY->nLTerm;
            if (pX->aLTerm[uVar5 - 1] != (WhereTerm *)0x0) {
              do {
                if ((long)uVar6 < 1) {
                  return 0;
                }
                lVar3 = uVar6 - 1;
                uVar6 = uVar6 - 1;
              } while (pY->aLTerm[lVar3] != pX->aLTerm[uVar5 - 1]);
            }
            bVar2 = 1 < (long)uVar5;
            uVar5 = uVar5 - 1;
          } while (bVar2);
        }
        if (((pX->wsFlags & 0x40) == 0) || ((pY->wsFlags & 0x40) != 0)) {
          iVar4 = 1;
        }
        return iVar4;
      }
    }
  }
  return 0;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0; /* X is not a subset of Y */
  }
  if( pY->nSkip > pX->nSkip ) return 0;
  if( pX->rRun >= pY->rRun ){
    if( pX->rRun > pY->rRun ) return 0;    /* X costs more than Y */
    if( pX->nOut > pY->nOut ) return 0;    /* X costs more than Y */
  }
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;  /* X not a subset of Y since term X[i] not used by Y */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0 
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;  /* Constraint (5) */
  }
  return 1;  /* All conditions meet */
}